

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

void __thiscall siamese::EncoderPacketWindow::ResetSums(EncoderPacketWindow *this,uint elementStart)

{
  ulong uVar1;
  EncoderPacketWindow *pEVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  pEVar2 = this;
  for (uVar1 = 0; uVar1 != 8; uVar1 = uVar1 + 1) {
    uVar4 = uVar1 | elementStart & 0xfffffff8;
    uVar3 = (int)uVar4 + 8;
    lVar5 = -0xc;
    if (elementStart <= uVar4) {
      uVar3 = (uint)uVar1 | elementStart & 0xfffffff8;
    }
    for (; lVar5 != 0; lVar5 = lVar5 + 4) {
      *(uint *)((long)pEVar2->Lanes[0].Sum + lVar5 + -4) = uVar3;
      pEVar2->Lanes[1].NextElement[lVar5] = 0;
    }
    pEVar2 = (EncoderPacketWindow *)((pEVar2->Subwindows).PreallocatedData + 2);
  }
  this->SumStartElement = elementStart;
  this->SumEndElement = elementStart;
  this->SumColumnStart = elementStart + this->ColumnStart & 0x3fffff;
  this->SumErasedCount = 0;
  return;
}

Assistant:

void EncoderPacketWindow::ResetSums(unsigned elementStart)
{
    // Recreate all the sums from scratch after this:
    for (unsigned laneIndex = 0; laneIndex < kColumnLaneCount; ++laneIndex)
    {
        // Calculate first element to accumulate for this lane
        const unsigned nextElement = GetNextLaneElement(elementStart, laneIndex);

        for (unsigned sumIndex = 0; sumIndex < kColumnSumCount; ++sumIndex)
        {
            Lanes[laneIndex].NextElement[sumIndex] = nextElement;
            Lanes[laneIndex].Sum[sumIndex].Bytes   = 0;
        }
    }

    SumStartElement = elementStart;
    SumEndElement   = elementStart;
    SumColumnStart  = ElementToColumn(elementStart);
    SumErasedCount  = 0;
}